

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointDimensions::test_method(PointDimensions *this)

{
  undefined4 local_2fc;
  long local_2f8;
  undefined4 *local_2f0;
  long *local_2e8;
  undefined **local_2e0;
  undefined1 local_2d8;
  undefined8 *local_2d0;
  char *local_2c8;
  undefined1 local_2c0 [8];
  undefined8 local_2b8;
  shared_count sStack_2b0;
  undefined **local_2a8;
  undefined1 local_2a0;
  undefined8 *local_298;
  undefined4 **local_290;
  undefined **local_288;
  undefined1 local_280;
  undefined8 *local_278;
  long **local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  SO3<mnf::ExpMapMatrix> S;
  Point p;
  void *local_150;
  ConstSubPoint local_140 [272];
  
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&S);
  mnf::Manifold::createRandomPoint(1.0);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x58);
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_00129c80;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = "";
  local_2f8 = mnf::Point::getDimM();
  local_2e8 = &local_2f8;
  local_2c0[0] = local_2f8 == 3;
  local_2f0 = &local_2fc;
  local_2fc = 3;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_260 = "";
  local_270 = &local_2e8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00129cc0;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2f0;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_00129d00;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2e0,&local_268,0x58,1,2,2,"p.getDimM()",&local_288,"3",&local_2a8);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x59);
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_00129c80;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = "";
  local_2f8 = mnf::Point::getTangentDimM();
  local_2fc = 3;
  local_2c0[0] = local_2f8 == 3;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_260 = "";
  local_2e8 = &local_2f8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00129cc0;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_2e8;
  local_2f0 = &local_2fc;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_00129d00;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2e0,&local_268,0x59,1,2,2,"p.getTangentDimM()",&local_288,"3",
             &local_2a8);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x5a);
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_00129c80;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = "";
  local_2f8 = mnf::Point::getRepresentationDimM();
  local_2fc = 9;
  local_2c0[0] = local_2f8 == 9;
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_260 = "";
  local_2e8 = &local_2f8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00129cc0;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_2e8;
  local_2f0 = &local_2fc;
  local_2a0 = 0;
  local_2a8 = &PTR__lazy_ostream_00129d00;
  local_298 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (local_2c0,&local_2e0,&local_268,0x5a,1,2,2,"p.getRepresentationDimM()",&local_288,"9",
             &local_2a8);
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  mnf::ConstSubPoint::~ConstSubPoint(local_140);
  free(local_150);
  S._0_8_ = &PTR__SO3_001299c0;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap(&S.bufferMap_);
  mnf::Manifold::~Manifold(&S.super_Manifold);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointDimensions)
{
  SO3<ExpMapMatrix> S;
  Point p = S.createRandomPoint();
  BOOST_CHECK_EQUAL(p.getDimM(), 3);
  BOOST_CHECK_EQUAL(p.getTangentDimM(), 3);
  BOOST_CHECK_EQUAL(p.getRepresentationDimM(), 9);
}